

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5ExprNew(Fts5Config *pConfig,int bPhraseToAnd,int iCol,char *zExpr,Fts5Expr **ppNew,
                      char **pzErr)

{
  Fts5Token fts5yyminor;
  char **pz;
  undefined4 *puVar1;
  undefined8 *puVar2;
  int in_EDX;
  long in_RDI;
  undefined8 *in_R8;
  long *in_R9;
  long in_FS_OFFSET;
  Fts5Colset *pColset;
  int n;
  Fts5Expr *pNew;
  void *pEngine;
  int t;
  char *z;
  Fts5Token token;
  Fts5Parse sParse;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  uint uVar3;
  Fts5Parse *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff64;
  Fts5Token *pToken;
  undefined4 in_stack_ffffffffffffff78;
  int iVar4;
  int local_54;
  undefined1 local_38 [8];
  long local_30;
  int local_28;
  undefined4 local_24;
  undefined8 local_20;
  undefined8 local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_38,0xaa,0x30);
  iVar4 = -0x55555556;
  pToken = (Fts5Token *)&DAT_aaaaaaaaaaaaaaaa;
  *in_R8 = 0;
  *in_R9 = 0;
  memset(local_38,0,0x30);
  pz = (char **)sqlite3Fts5ParserAlloc
                          ((_func_void_ptr_u64 *)
                           CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  if (pz == (char **)0x0) {
    local_54 = 7;
  }
  else {
    do {
      iVar4 = fts5ExprGetToken((Fts5Parse *)CONCAT44(iVar4,in_stack_ffffffffffffff78),pz,pToken);
      fts5yyminor._8_8_ = in_R8;
      fts5yyminor.p = (char *)in_R9;
      sqlite3Fts5Parser(pToken,in_stack_ffffffffffffff64,fts5yyminor,in_stack_ffffffffffffff58);
      uVar3 = in_stack_ffffffffffffff54 & 0xffffff;
      if (local_28 == 0) {
        uVar3 = CONCAT13(iVar4 != 0,(int3)in_stack_ffffffffffffff54);
      }
      in_stack_ffffffffffffff54 = uVar3;
    } while ((char)(uVar3 >> 0x18) != '\0');
    sqlite3Fts5ParserFree
              ((void *)CONCAT44(uVar3,in_stack_ffffffffffffff50),
               (_func_void_void_ptr *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48))
    ;
    if (((local_28 == 0) && (in_EDX < *(int *)(in_RDI + 0x20))) &&
       (puVar1 = (undefined4 *)
                 sqlite3Fts5MallocZero
                           ((int *)CONCAT44(uVar3,in_stack_ffffffffffffff50),
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)),
       puVar1 != (undefined4 *)0x0)) {
      *puVar1 = 1;
      puVar1[1] = in_EDX;
      sqlite3Fts5ParseSetColset
                ((Fts5Parse *)CONCAT44(uVar3,in_stack_ffffffffffffff50),
                 (Fts5ExprNode *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                 (Fts5Colset *)0x26bd20);
    }
    if (local_28 == 0) {
      puVar2 = (undefined8 *)sqlite3_malloc(in_stack_ffffffffffffff4c);
      *in_R8 = puVar2;
      if (puVar2 == (undefined8 *)0x0) {
        local_28 = 7;
        sqlite3Fts5ParseNodeFree((Fts5ExprNode *)CONCAT44(uVar3,in_stack_ffffffffffffff50));
      }
      else {
        puVar2[2] = local_18;
        *puVar2 = 0;
        puVar2[1] = in_RDI;
        puVar2[4] = local_20;
        *(undefined4 *)((long)puVar2 + 0x1c) = local_24;
        *(undefined4 *)(puVar2 + 3) = 0;
        local_20 = 0;
      }
    }
    else {
      sqlite3Fts5ParseNodeFree((Fts5ExprNode *)CONCAT44(uVar3,in_stack_ffffffffffffff50));
    }
    sqlite3_free((void *)0x26bdeb);
    if (*in_R9 == 0) {
      *in_R9 = local_30;
    }
    else {
      sqlite3_free((void *)0x26be16);
    }
    local_54 = local_28;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_54;
}

Assistant:

static int sqlite3Fts5ExprNew(
  Fts5Config *pConfig,            /* FTS5 Configuration */
  int bPhraseToAnd,
  int iCol,
  const char *zExpr,              /* Expression text */
  Fts5Expr **ppNew,
  char **pzErr
){
  Fts5Parse sParse;
  Fts5Token token;
  const char *z = zExpr;
  int t;                          /* Next token type */
  void *pEngine;
  Fts5Expr *pNew;

  *ppNew = 0;
  *pzErr = 0;
  memset(&sParse, 0, sizeof(sParse));
  sParse.bPhraseToAnd = bPhraseToAnd;
  pEngine = sqlite3Fts5ParserAlloc(fts5ParseAlloc);
  if( pEngine==0 ){ return SQLITE_NOMEM; }
  sParse.pConfig = pConfig;

  do {
    t = fts5ExprGetToken(&sParse, &z, &token);
    sqlite3Fts5Parser(pEngine, t, token, &sParse);
  }while( sParse.rc==SQLITE_OK && t!=FTS5_EOF );
  sqlite3Fts5ParserFree(pEngine, fts5ParseFree);

  assert( sParse.pExpr || sParse.rc!=SQLITE_OK );
  assert_expr_depth_ok(sParse.rc, sParse.pExpr);

  /* If the LHS of the MATCH expression was a user column, apply the
  ** implicit column-filter.  */
  if( sParse.rc==SQLITE_OK && iCol<pConfig->nCol ){
    int n = sizeof(Fts5Colset);
    Fts5Colset *pColset = (Fts5Colset*)sqlite3Fts5MallocZero(&sParse.rc, n);
    if( pColset ){
      pColset->nCol = 1;
      pColset->aiCol[0] = iCol;
      sqlite3Fts5ParseSetColset(&sParse, sParse.pExpr, pColset);
    }
  }

  assert( sParse.rc!=SQLITE_OK || sParse.zErr==0 );
  if( sParse.rc==SQLITE_OK ){
    *ppNew = pNew = sqlite3_malloc(sizeof(Fts5Expr));
    if( pNew==0 ){
      sParse.rc = SQLITE_NOMEM;
      sqlite3Fts5ParseNodeFree(sParse.pExpr);
    }else{
      pNew->pRoot = sParse.pExpr;
      pNew->pIndex = 0;
      pNew->pConfig = pConfig;
      pNew->apExprPhrase = sParse.apPhrase;
      pNew->nPhrase = sParse.nPhrase;
      pNew->bDesc = 0;
      sParse.apPhrase = 0;
    }
  }else{
    sqlite3Fts5ParseNodeFree(sParse.pExpr);
  }

  sqlite3_free(sParse.apPhrase);
  if( 0==*pzErr ){
    *pzErr = sParse.zErr;
  }else{
    sqlite3_free(sParse.zErr);
  }
  return sParse.rc;
}